

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

size_t FileStream_Prefix(TCHAR *szFileName,DWORD *pdwProvider)

{
  int iVar1;
  uint local_34;
  long lStack_30;
  DWORD dwProvider;
  size_t nPrefixLength2;
  size_t nPrefixLength1;
  DWORD *pdwProvider_local;
  TCHAR *szFileName_local;
  
  nPrefixLength2 = 0;
  lStack_30 = 0;
  local_34 = 0;
  if (szFileName != (TCHAR *)0x0) {
    iVar1 = strncasecmp(szFileName,"flat-",5);
    if (iVar1 == 0) {
      local_34 = 0;
      nPrefixLength2 = 5;
    }
    else {
      iVar1 = strncasecmp(szFileName,"part-",5);
      if (iVar1 == 0) {
        local_34 = 0x10;
        nPrefixLength2 = 5;
      }
      else {
        iVar1 = strncasecmp(szFileName,"mpqe-",5);
        if (iVar1 == 0) {
          local_34 = 0x20;
          nPrefixLength2 = 5;
        }
        else {
          iVar1 = strncasecmp(szFileName,"blk4-",5);
          if (iVar1 == 0) {
            local_34 = 0x30;
            nPrefixLength2 = 5;
          }
        }
      }
    }
    iVar1 = strncasecmp(szFileName + nPrefixLength2,"file:",5);
    if (iVar1 == 0) {
      lStack_30 = 5;
    }
    else {
      iVar1 = strncasecmp(szFileName + nPrefixLength2,"map:",4);
      if (iVar1 == 0) {
        local_34 = local_34 | 1;
        lStack_30 = 4;
      }
      else {
        iVar1 = strncasecmp(szFileName + nPrefixLength2,"http:",5);
        if (iVar1 == 0) {
          local_34 = local_34 | 2;
          lStack_30 = 5;
        }
      }
    }
    if (lStack_30 != 0) {
      if ((szFileName[nPrefixLength2 + lStack_30] == '/') &&
         (szFileName[nPrefixLength2 + lStack_30 + 1] == '/')) {
        lStack_30 = lStack_30 + 2;
      }
      if (pdwProvider != (DWORD *)0x0) {
        *pdwProvider = local_34;
      }
      return nPrefixLength2 + lStack_30;
    }
  }
  return 0;
}

Assistant:

size_t FileStream_Prefix(const TCHAR * szFileName, DWORD * pdwProvider)
{
    size_t nPrefixLength1 = 0;
    size_t nPrefixLength2 = 0;
    DWORD dwProvider = 0;

    if(szFileName != NULL)
    {
        //
        // Determine the stream provider
        //

        if(!_tcsnicmp(szFileName, _T("flat-"), 5))
        {
            dwProvider |= STREAM_PROVIDER_FLAT;
            nPrefixLength1 = 5;
        }

        else if(!_tcsnicmp(szFileName, _T("part-"), 5))
        {
            dwProvider |= STREAM_PROVIDER_PARTIAL;
            nPrefixLength1 = 5;
        }

        else if(!_tcsnicmp(szFileName, _T("mpqe-"), 5))
        {
            dwProvider |= STREAM_PROVIDER_ENCRYPTED;
            nPrefixLength1 = 5;
        }

        else if(!_tcsnicmp(szFileName, _T("blk4-"), 5))
        {
            dwProvider |= STREAM_PROVIDER_BLOCK4;
            nPrefixLength1 = 5;
        }

        //
        // Determine the base provider
        //

        if(!_tcsnicmp(szFileName+nPrefixLength1, _T("file:"), 5))
        {
            dwProvider |= BASE_PROVIDER_FILE;
            nPrefixLength2 = 5;
        }

        else if(!_tcsnicmp(szFileName+nPrefixLength1, _T("map:"), 4))
        {
            dwProvider |= BASE_PROVIDER_MAP;
            nPrefixLength2 = 4;
        }

        else if(!_tcsnicmp(szFileName+nPrefixLength1, _T("http:"), 5))
        {
            dwProvider |= BASE_PROVIDER_HTTP;
            nPrefixLength2 = 5;
        }

        // Only accept stream provider if we recognized the base provider
        if(nPrefixLength2 != 0)
        {
            // It is also allowed to put "//" after the base provider, e.g. "file://", "http://"
            if(szFileName[nPrefixLength1+nPrefixLength2] == '/' && szFileName[nPrefixLength1+nPrefixLength2+1] == '/')
                nPrefixLength2 += 2;

            if(pdwProvider != NULL)
                *pdwProvider = dwProvider;
            return nPrefixLength1 + nPrefixLength2;
        }
    }

    return 0;
}